

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Reach.c
# Opt level: O2

DdNode * Llb_ManComputeInitState(Llb_Man_t *p,DdManager *dd)

{
  abctime aVar1;
  Aig_Man_t *pAVar2;
  int i;
  DdNode *n;
  void *pvVar3;
  DdNode *pDVar4;
  int iVar5;
  
  aVar1 = dd->TimeStop;
  dd->TimeStop = 0;
  n = Cudd_ReadOne(dd);
  Cudd_Ref(n);
  for (iVar5 = 0; pAVar2 = p->pAig, iVar5 < pAVar2->nRegs; iVar5 = iVar5 + 1) {
    pvVar3 = Vec_PtrEntry(pAVar2->vCis,pAVar2->nTruePis + iVar5);
    i = iVar5;
    if (p->ddG != dd) {
      i = Vec_IntEntry(p->vObj2Var,*(int *)((long)pvVar3 + 0x24));
    }
    pDVar4 = Cudd_bddIthVar(dd,i);
    pDVar4 = Cudd_bddAnd(dd,n,(DdNode *)((ulong)pDVar4 ^ 1));
    Cudd_Ref(pDVar4);
    Cudd_RecursiveDeref(dd,n);
    n = pDVar4;
  }
  Cudd_Deref(n);
  dd->TimeStop = aVar1;
  return n;
}

Assistant:

DdNode * Llb_ManComputeInitState( Llb_Man_t * p, DdManager * dd )
{
    Aig_Obj_t * pObj;
    DdNode * bRes, * bVar, * bTemp;
    int i, iVar;
    abctime TimeStop;
    TimeStop = dd->TimeStop; dd->TimeStop = 0;
    bRes = Cudd_ReadOne( dd );   Cudd_Ref( bRes );
    Saig_ManForEachLo( p->pAig, pObj, i )
    {
        iVar  = (dd == p->ddG) ? i : Vec_IntEntry(p->vObj2Var, Aig_ObjId(pObj));
        bVar  = Cudd_bddIthVar( dd, iVar );
        bRes  = Cudd_bddAnd( dd, bTemp = bRes, Cudd_Not(bVar) );  Cudd_Ref( bRes );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    Cudd_Deref( bRes );
    dd->TimeStop = TimeStop;
    return bRes;
}